

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

string * __thiscall wabt::Type::GetName_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  Enum EVar1;
  allocator<char> *__a;
  char *pcVar2;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  EVar1 = this->enum_;
  switch(EVar1) {
  case Any:
    pcVar2 = "any";
    __a = &local_13;
    break;
  case Reference:
    EVar1 = this->type_index_;
    pcVar2 = "(ref %d)";
    goto LAB_0010fb30;
  case ExternRef:
    pcVar2 = "externref";
    __a = &local_14;
    break;
  case FuncRef:
    pcVar2 = "funcref";
    __a = &local_10;
    break;
  case I16:
    pcVar2 = "i16";
    __a = &local_f;
    break;
  case I8:
    pcVar2 = "i8";
    __a = &local_e;
    break;
  case V128:
    pcVar2 = "v128";
    __a = &local_d;
    break;
  case F64:
    pcVar2 = "f64";
    __a = &local_c;
    break;
  case F32:
    pcVar2 = "f32";
    __a = &local_b;
    break;
  case I64:
    pcVar2 = "i64";
    __a = &local_a;
    break;
  case I32:
    pcVar2 = "i32";
    __a = &local_9;
    break;
  default:
    if (EVar1 == Void) {
      pcVar2 = "void";
      __a = &local_12;
      break;
    }
    if (EVar1 == Func) {
      pcVar2 = "func";
      __a = &local_11;
      break;
    }
  case 0xffffffec:
  case 0xffffffed:
  case 0xffffffee:
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
    pcVar2 = "<type_index[%d]>";
LAB_0010fb30:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar2,(ulong)(uint)EVar1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,pcVar2,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const {
    switch (enum_) {
      case Type::I32:       return "i32";
      case Type::I64:       return "i64";
      case Type::F32:       return "f32";
      case Type::F64:       return "f64";
      case Type::V128:      return "v128";
      case Type::I8:        return "i8";
      case Type::I16:       return "i16";
      case Type::FuncRef:   return "funcref";
      case Type::Func:      return "func";
      case Type::Void:      return "void";
      case Type::Any:       return "any";
      case Type::ExternRef: return "externref";
      case Type::Reference:
        return StringPrintf("(ref %d)", type_index_);
      default:
        return StringPrintf("<type_index[%d]>", enum_);
    }
  }